

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

void __thiscall
duckdb::IEJoinUnion::IEJoinUnion
          (IEJoinUnion *this,ClientContext *context,PhysicalIEJoin *op,SortedTable *t1,idx_t b1,
          SortedTable *t2,idx_t b2)

{
  unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
  *this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  __int_type _Var1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::BoundReferenceExpression_*,_false> _Var3;
  pointer ppEVar4;
  bool bVar5;
  int iVar6;
  idx_t iVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  const_reference __args;
  pointer pEVar10;
  type pEVar11;
  type pBVar12;
  type pGVar13;
  pointer pGVar14;
  reference pvVar15;
  type marked;
  long base_00;
  ExpressionType *args_1;
  idx_t block_idx;
  ulong uVar16;
  idx_t base;
  unsigned_long val;
  vector<duckdb::JoinCondition,_true> *this_02;
  _Head_base<0UL,_duckdb::BoundReferenceExpression_*,_false> local_438;
  SortedTable *local_430;
  vector<duckdb::LogicalType,_true> types;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_3f8;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_3f0;
  _Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
  local_3e8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_3e0;
  vector<duckdb::BoundOrderByNode,_true> orders;
  ExpressionExecutor executor;
  ExpressionExecutor l_executor;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2d0;
  ExpressionExecutor r_executor;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_270;
  RowLayout payload_layout;
  SBIterator bounds2;
  SBIterator bounds1;
  
  this_00 = &this->l2;
  (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->bit_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
  (this->bit_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bit_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->p).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->p).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->li).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (this->p).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->li).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->li).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->l1).
  super_unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  .super__Head_base<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_false> =
       (_Head_base<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_false>)0x0;
  (this->l2).
  super_unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  .super__Head_base<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_false>._M_head_impl =
       (GlobalSortedTable *)0x0;
  (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  (this->bloom_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bloom_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->bloom_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  this->n = 0;
  this->i = 0;
  (this->op1).super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
  super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl = (SBIterator *)0x0;
  (this->off1).super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
  super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl = (SBIterator *)0x0;
  (this->op2).super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
  super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl = (SBIterator *)0x0;
  (this->off2).super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
  super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl = (SBIterator *)0x0;
  iVar7 = PhysicalRangeJoin::GlobalSortedTable::BlockSize(t1,b1);
  if (iVar7 != 0) {
    iVar7 = PhysicalRangeJoin::GlobalSortedTable::BlockSize(t2,b2);
    if (iVar7 != 0) {
      this_02 = &(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions;
      local_430 = t2;
      pvVar8 = vector<duckdb::JoinCondition,_true>::get<true>(this_02,0);
      SBIterator::SBIterator(&bounds1,&t1->global_sort_state,pvVar8->comparison,0);
      args_1 = &pvVar8->comparison;
      SBIterator::SBIterator(&bounds2,&local_430->global_sort_state,*args_1,0);
      SBIterator::SetIndex(&bounds1,bounds1.block_capacity * b1);
      iVar7 = PhysicalRangeJoin::GlobalSortedTable::BlockSize(local_430,b2);
      SBIterator::SetIndex(&bounds2,(iVar7 + bounds2.block_capacity * b2) - 1);
      bVar5 = SBIterator::Compare(&bounds1,&bounds2);
      if (bVar5) {
        pvVar9 = vector<duckdb::BoundOrderByNode,_true>::get<true>(&op->lhs_orders,0);
        __args = vector<duckdb::BoundOrderByNode,_true>::get<true>(&op->lhs_orders,1);
        types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_01 = &__args->expression;
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_01);
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalType&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&types,
                   &pEVar10->return_type);
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalTypeId_const&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&types,
                   &LogicalType::BIGINT);
        RowLayout::RowLayout(&payload_layout);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_270,
                   &types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        RowLayout::Initialize(&payload_layout,(vector<duckdb::LogicalType,_true> *)&local_270,true);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_270);
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(&pvVar9->expression);
        l_executor.expressions.
        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)l_executor.expressions.
                              super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                              .
                              super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
        make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType&,unsigned_int>
                  ((duckdb *)&local_438,&pEVar10->return_type,(uint *)&l_executor);
        orders.super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        orders.super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        orders.super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
        emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                  ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                   &orders,&pvVar9->type,&pvVar9->null_order,
                   (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                    *)&local_438);
        Value::BOOLEAN((Value *)&l_executor,true);
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                  ((duckdb *)&local_3e8,(Value *)&l_executor);
        Value::~Value((Value *)&l_executor);
        iVar6 = SBIterator::ComparisonValue(*args_1);
        l_executor.expressions.
        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(CONCAT71(l_executor.expressions.
                                super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                .
                                super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,iVar6 == 0) | 2);
        r_executor.expressions.
        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
        ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
        emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                  ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                   &orders,(OrderType *)&l_executor,(OrderByNullType *)&r_executor,
                   (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                    *)&local_3e8);
        make_uniq<duckdb::PhysicalRangeJoin::GlobalSortedTable,duckdb::ClientContext&,duckdb::vector<duckdb::BoundOrderByNode,true>&,duckdb::RowLayout&,duckdb::PhysicalIEJoin_const&>
                  ((duckdb *)&l_executor,context,&orders,&payload_layout,op);
        ppEVar4 = l_executor.expressions.
                  super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                  .
                  super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        l_executor.expressions.
        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ::std::
        __uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
        ::reset((__uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
                 *)this,(pointer)ppEVar4);
        ::std::
        unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
        ::~unique_ptr((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
                       *)&l_executor);
        ExpressionExecutor::ExpressionExecutor(&l_executor,context);
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(&pvVar9->expression);
        ExpressionExecutor::AddExpression(&l_executor,pEVar11);
        Value::BOOLEAN((Value *)&r_executor,true);
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                  ((duckdb *)&local_3f0,(Value *)&r_executor);
        Value::~Value((Value *)&r_executor);
        pBVar12 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                  ::operator*((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                               *)&local_3f0);
        ExpressionExecutor::AddExpression(&l_executor,&pBVar12->super_Expression);
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(this_01);
        ExpressionExecutor::AddExpression(&l_executor,pEVar11);
        pGVar13 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                  ::operator*(&this->l1);
        AppendKey(t1,&l_executor,pGVar13,1,1,b1);
        ExpressionExecutor::ExpressionExecutor(&r_executor,context);
        pvVar9 = vector<duckdb::BoundOrderByNode,_true>::get<true>(&op->rhs_orders,0);
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(&pvVar9->expression);
        ExpressionExecutor::AddExpression(&r_executor,pEVar11);
        Value::BOOLEAN((Value *)&executor,false);
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                  ((duckdb *)&local_3f8,(Value *)&executor);
        Value::~Value((Value *)&executor);
        pBVar12 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                  ::operator*((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                               *)&local_3f8);
        ExpressionExecutor::AddExpression(&r_executor,&pBVar12->super_Expression);
        pvVar9 = vector<duckdb::BoundOrderByNode,_true>::get<true>(&op->rhs_orders,1);
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(&pvVar9->expression);
        ExpressionExecutor::AddExpression(&r_executor,pEVar11);
        pGVar13 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                  ::operator*(&this->l1);
        AppendKey(local_430,&r_executor,pGVar13,-1,-1,b2);
        pGVar14 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                  ::operator->(&this->l1);
        if ((pGVar14->global_sort_state).sorted_blocks.
            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pGVar14->global_sort_state).sorted_blocks.
            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pGVar13 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator*(&this->l1);
          Sort(pGVar13);
          pGVar14 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->(&this->l1);
          make_uniq<duckdb::SBIterator,duckdb::GlobalSortState&,duckdb::ExpressionType_const&>
                    ((duckdb *)&executor,&pGVar14->global_sort_state,args_1);
          ppEVar4 = executor.expressions.
                    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    .
                    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          executor.expressions.
          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ::std::__uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>::
          reset((__uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_> *)
                &this->op1,(pointer)ppEVar4);
          ::std::unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>::
          ~unique_ptr((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_> *)
                      &executor);
          pGVar14 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->(&this->l1);
          make_uniq<duckdb::SBIterator,duckdb::GlobalSortState&,duckdb::ExpressionType_const&>
                    ((duckdb *)&executor,&pGVar14->global_sort_state,args_1);
          ppEVar4 = executor.expressions.
                    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    .
                    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          executor.expressions.
          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ::std::__uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>::
          reset((__uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_> *)
                &this->off1,(pointer)ppEVar4);
          ::std::unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>::
          ~unique_ptr((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_> *)
                      &executor);
          pGVar13 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator*(&this->l1);
          ExtractColumn<long>((vector<long,_true> *)&executor,pGVar13,
                              ((long)types.
                                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     .
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)types.
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18 - 1);
          ::std::vector<long,_std::allocator<long>_>::_M_move_assign
                    (&(this->li).super_vector<long,_std::allocator<long>_>,&executor);
          ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                    ((_Vector_base<long,_std::allocator<long>_> *)&executor);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::clear
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&types);
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalTypeId_const&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&types,
                     &LogicalType::BIGINT);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_2d0,
                     &types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
          ;
          RowLayout::Initialize
                    (&payload_layout,(vector<duckdb::LogicalType,_true> *)&local_2d0,true);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_2d0);
          ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::clear
                    (&orders.
                      super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    );
          pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(this_01);
          local_3e0._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)local_3e0._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
          make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType&,unsigned_int>
                    ((duckdb *)&executor,&pEVar10->return_type,(uint *)&local_3e0);
          ppEVar4 = executor.expressions.
                    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    .
                    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          _Var3._M_head_impl = local_438._M_head_impl;
          executor.expressions.
          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_438._M_head_impl = (BoundReferenceExpression *)ppEVar4;
          if (_Var3._M_head_impl != (BoundReferenceExpression *)0x0) {
            (**(code **)&(((Expression *)
                          ((_Var3._M_head_impl)->super_Expression).super_BaseExpression.
                          _vptr_BaseExpression)->super_BaseExpression).type)();
            if (executor.expressions.
                super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                .
                super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (**(code **)&((*executor.expressions.
                              super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                              .
                              super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start)->super_BaseExpression).type
              )();
            }
          }
          ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
          emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                    ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                     &orders,&__args->type,&__args->null_order,
                     (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                      *)&local_438);
          ExpressionExecutor::ExpressionExecutor(&executor,context);
          pvVar15 = vector<duckdb::BoundOrderByNode,_true>::get<true>(&orders,0);
          pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(&pvVar15->expression);
          ExpressionExecutor::AddExpression(&executor,pEVar11);
          make_uniq<duckdb::PhysicalRangeJoin::GlobalSortedTable,duckdb::ClientContext&,duckdb::vector<duckdb::BoundOrderByNode,true>&,duckdb::RowLayout&,duckdb::PhysicalIEJoin_const&>
                    ((duckdb *)&local_3e0,context,&orders,&payload_layout,op);
          puVar2 = local_3e0._M_impl.super__Vector_impl_data._M_start;
          local_430 = (SortedTable *)&this->i;
          local_3e0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ::std::
          __uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
          ::reset((__uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
                   *)this_00,(pointer)puVar2);
          ::std::
          unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
          ::~unique_ptr((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
                         *)&local_3e0);
          val = 0;
          uVar16 = 0;
          while( true ) {
            pGVar14 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                      ::operator->(&this->l1);
            iVar7 = PhysicalRangeJoin::GlobalSortedTable::BlockCount(pGVar14);
            if (iVar7 <= uVar16) break;
            pGVar13 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                      ::operator*(&this->l1);
            marked = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                     ::operator*(this_00);
            base_00 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
            iVar7 = AppendKey(pGVar13,&executor,marked,1,base_00,uVar16);
            val = val + iVar7;
            uVar16 = uVar16 + 1;
          }
          pGVar13 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator*(this_00);
          Sort(pGVar13);
          pGVar13 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator*(this_00);
          ExtractColumn<unsigned_long>
                    ((vector<unsigned_long,_true> *)&local_3e0,pGVar13,
                     ((long)types.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)types.
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18 - 1);
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                    (&(this->p).super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                     &local_3e0);
          ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&local_3e0);
          pGVar14 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->(this_00);
          _Var1 = (pGVar14->count).super___atomic_base<unsigned_long>._M_i;
          this->n = _Var1;
          local_3e0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    (&(this->bit_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                     _Var1 + 0x3f >> 6,(value_type_conflict *)&local_3e0);
          puVar2 = (this->bit_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar7 = this->n;
          ::std::
          __shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>::
          reset((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 *)&(this->bit_mask).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar2;
          (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.capacity = iVar7;
          uVar16 = this->n + 0x3ff >> 10;
          this->bloom_count = uVar16;
          local_3e0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    (&(this->bloom_array).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>,uVar16 + 0x3f >> 6
                     ,(value_type_conflict *)&local_3e0);
          iVar7 = this->bloom_count;
          puVar2 = (this->bloom_array).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          ::std::
          __shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>::
          reset((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 *)&(this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar2;
          (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.capacity = iVar7;
          pvVar8 = vector<duckdb::JoinCondition,_true>::get<true>(this_02,1);
          pGVar14 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->(this_00);
          make_uniq<duckdb::SBIterator,duckdb::GlobalSortState&,duckdb::ExpressionType_const&>
                    ((duckdb *)&local_3e0,&pGVar14->global_sort_state,&pvVar8->comparison);
          puVar2 = local_3e0._M_impl.super__Vector_impl_data._M_start;
          local_3e0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ::std::__uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>::
          reset((__uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_> *)
                &this->op2,(pointer)puVar2);
          ::std::unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>::
          ~unique_ptr((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_> *)
                      &local_3e0);
          pGVar14 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->(this_00);
          make_uniq<duckdb::SBIterator,duckdb::GlobalSortState&,duckdb::ExpressionType_const&>
                    ((duckdb *)&local_3e0,&pGVar14->global_sort_state,&pvVar8->comparison);
          puVar2 = local_3e0._M_impl.super__Vector_impl_data._M_start;
          local_3e0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ::std::__uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>::
          reset((__uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_> *)
                &this->off2,(pointer)puVar2);
          ::std::unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>::
          ~unique_ptr((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_> *)
                      &local_3e0);
          local_430->op = (PhysicalOperator *)0x0;
          (local_430->global_sort_state).context = (ClientContext *)0x0;
          NextRow(this);
          ExpressionExecutor::~ExpressionExecutor(&executor);
        }
        if (local_3f8._M_head_impl != (BoundConstantExpression *)0x0) {
          (*((local_3f8._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression
            [1])();
        }
        ExpressionExecutor::~ExpressionExecutor(&r_executor);
        if (local_3f0._M_head_impl != (BoundConstantExpression *)0x0) {
          (*((local_3f0._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression
            [1])();
        }
        ExpressionExecutor::~ExpressionExecutor(&l_executor);
        if (local_3e8.super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>._M_head_impl
            != (BoundConstantExpression *)0x0) {
          (**(code **)(*(long *)local_3e8.
                                super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>.
                                _M_head_impl + 8))();
        }
        ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
                  (&orders.
                    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                  );
        if (local_438._M_head_impl != (BoundReferenceExpression *)0x0) {
          (**(code **)&(((Expression *)
                        ((local_438._M_head_impl)->super_Expression).super_BaseExpression.
                        _vptr_BaseExpression)->super_BaseExpression).type)();
        }
        RowLayout::~RowLayout(&payload_layout);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      }
      SBScanState::~SBScanState(&bounds2.scan);
      SBScanState::~SBScanState(&bounds1.scan);
    }
  }
  return;
}

Assistant:

IEJoinUnion::IEJoinUnion(ClientContext &context, const PhysicalIEJoin &op, SortedTable &t1, const idx_t b1,
                         SortedTable &t2, const idx_t b2)
    : n(0), i(0) {
	// input : query Q with 2 join predicates t1.X op1 t2.X' and t1.Y op2 t2.Y', tables T, T' of sizes m and n resp.
	// output: a list of tuple pairs (ti , tj)
	// Note that T/T' are already sorted on X/X' and contain the payload data
	// We only join the two block numbers and use the sizes of the blocks as the counts

	// 0. Filter out tables with no overlap
	if (!t1.BlockSize(b1) || !t2.BlockSize(b2)) {
		return;
	}

	const auto &cmp1 = op.conditions[0].comparison;
	SBIterator bounds1(t1.global_sort_state, cmp1);
	SBIterator bounds2(t2.global_sort_state, cmp1);

	// t1.X[0] op1 t2.X'[-1]
	bounds1.SetIndex(bounds1.block_capacity * b1);
	bounds2.SetIndex(bounds2.block_capacity * b2 + t2.BlockSize(b2) - 1);
	if (!bounds1.Compare(bounds2)) {
		return;
	}

	// 1. let L1 (resp. L2) be the array of column X (resp. Y )
	const auto &order1 = op.lhs_orders[0];
	const auto &order2 = op.lhs_orders[1];

	// 2. if (op1 ∈ {>, ≥}) sort L1 in descending order
	// 3. else if (op1 ∈ {<, ≤}) sort L1 in ascending order

	// For the union algorithm, we make a unified table with the keys and the rids as the payload:
	//		X/X', Y/Y', R/R'/Li
	// The first position is the sort key.
	vector<LogicalType> types;
	types.emplace_back(order2.expression->return_type);
	types.emplace_back(LogicalType::BIGINT);
	RowLayout payload_layout;
	payload_layout.Initialize(types);

	// Sort on the first expression
	auto ref = make_uniq<BoundReferenceExpression>(order1.expression->return_type, 0U);
	vector<BoundOrderByNode> orders;
	orders.emplace_back(order1.type, order1.null_order, std::move(ref));
	// The goal is to make i (from the left table) < j (from the right table),
	// if value[i] and value[j] match the condition 1.
	// Add a column from_left to solve the problem when there exist multiple equal values in l1.
	// If the operator is loose inequality, make t1.from_left (== true) sort BEFORE t2.from_left (== false).
	// Otherwise, make t1.from_left sort (== true) sort AFTER t2.from_left (== false).
	// For example, if t1.time <= t2.time
	// | value     | 1     | 1     | 1     | 1     |
	// | --------- | ----- | ----- | ----- | ----- |
	// | from_left | T(l2) | T(l2) | F(r1) | F(r2) |
	// if t1.time < t2.time
	// | value     | 1     | 1     | 1     | 1     |
	// | --------- | ----- | ----- | ----- | ----- |
	// | from_left | F(r2) | F(r1) | T(l2) | T(l1) |
	// Using this OrderType, if i < j then value[i] (from left table) and value[j] (from right table) match
	// the condition (t1.time <= t2.time or t1.time < t2.time), then from_left will force them into the correct order.
	auto from_left = make_uniq<BoundConstantExpression>(Value::BOOLEAN(true));
	orders.emplace_back(SBIterator::ComparisonValue(cmp1) == 0 ? OrderType::DESCENDING : OrderType::ASCENDING,
	                    OrderByNullType::ORDER_DEFAULT, std::move(from_left));

	l1 = make_uniq<SortedTable>(context, orders, payload_layout, op);

	// LHS has positive rids
	ExpressionExecutor l_executor(context);
	l_executor.AddExpression(*order1.expression);
	// add const column true
	auto left_const = make_uniq<BoundConstantExpression>(Value::BOOLEAN(true));
	l_executor.AddExpression(*left_const);
	l_executor.AddExpression(*order2.expression);
	AppendKey(t1, l_executor, *l1, 1, 1, b1);

	// RHS has negative rids
	ExpressionExecutor r_executor(context);
	r_executor.AddExpression(*op.rhs_orders[0].expression);
	// add const column flase
	auto right_const = make_uniq<BoundConstantExpression>(Value::BOOLEAN(false));
	r_executor.AddExpression(*right_const);
	r_executor.AddExpression(*op.rhs_orders[1].expression);
	AppendKey(t2, r_executor, *l1, -1, -1, b2);

	if (l1->global_sort_state.sorted_blocks.empty()) {
		return;
	}

	Sort(*l1);

	op1 = make_uniq<SBIterator>(l1->global_sort_state, cmp1);
	off1 = make_uniq<SBIterator>(l1->global_sort_state, cmp1);

	// We don't actually need the L1 column, just its sort key, which is in the sort blocks
	li = ExtractColumn<int64_t>(*l1, types.size() - 1);

	// 4. if (op2 ∈ {>, ≥}) sort L2 in ascending order
	// 5. else if (op2 ∈ {<, ≤}) sort L2 in descending order

	// We sort on Y/Y' to obtain the sort keys and the permutation array.
	// For this we just need a two-column table of Y, P
	types.clear();
	types.emplace_back(LogicalType::BIGINT);
	payload_layout.Initialize(types);

	// Sort on the first expression
	orders.clear();
	ref = make_uniq<BoundReferenceExpression>(order2.expression->return_type, 0U);
	orders.emplace_back(order2.type, order2.null_order, std::move(ref));

	ExpressionExecutor executor(context);
	executor.AddExpression(*orders[0].expression);

	l2 = make_uniq<SortedTable>(context, orders, payload_layout, op);
	for (idx_t base = 0, block_idx = 0; block_idx < l1->BlockCount(); ++block_idx) {
		base += AppendKey(*l1, executor, *l2, 1, NumericCast<int64_t>(base), block_idx);
	}

	Sort(*l2);

	// We don't actually need the L2 column, just its sort key, which is in the sort blocks

	// 6. compute the permutation array P of L2 w.r.t. L1
	p = ExtractColumn<idx_t>(*l2, types.size() - 1);

	// 7. initialize bit-array B (|B| = n), and set all bits to 0
	n = l2->count.load();
	bit_array.resize(ValidityMask::EntryCount(n), 0);
	bit_mask.Initialize(bit_array.data(), n);

	// Bloom filter
	bloom_count = (n + (BLOOM_CHUNK_BITS - 1)) / BLOOM_CHUNK_BITS;
	bloom_array.resize(ValidityMask::EntryCount(bloom_count), 0);
	bloom_filter.Initialize(bloom_array.data(), bloom_count);

	// 11. for(i←1 to n) do
	const auto &cmp2 = op.conditions[1].comparison;
	op2 = make_uniq<SBIterator>(l2->global_sort_state, cmp2);
	off2 = make_uniq<SBIterator>(l2->global_sort_state, cmp2);
	i = 0;
	j = 0;
	(void)NextRow();
}